

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O3

void __thiscall cmCTestLaunch::WriteXMLAction(cmCTestLaunch *this,cmXMLElement *e2)

{
  size_type sVar1;
  pointer pcVar2;
  cmXMLElement cVar3;
  bool bVar4;
  int iVar5;
  string *psVar6;
  string source;
  cmXMLElement e3;
  string local_68;
  cmXMLElement local_48;
  string local_40;
  
  cmXMLWriter::Comment(e2->xmlwr,"Meta-information about the build action");
  cmXMLElement::cmXMLElement(&local_48,e2,"Action");
  if ((this->OptionTargetName)._M_string_length != 0) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"TargetName","");
    cVar3.xmlwr = local_48.xmlwr;
    cmXMLWriter::StartElement(local_48.xmlwr,&local_68);
    cmXMLWriter::Content<std::__cxx11::string>(cVar3.xmlwr,&this->OptionTargetName);
    cmXMLWriter::EndElement(cVar3.xmlwr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->OptionLanguage)._M_string_length != 0) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Language","");
    cVar3.xmlwr = local_48.xmlwr;
    cmXMLWriter::StartElement(local_48.xmlwr,&local_68);
    cmXMLWriter::Content<std::__cxx11::string>(cVar3.xmlwr,&this->OptionLanguage);
    cmXMLWriter::EndElement(cVar3.xmlwr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  sVar1 = (this->OptionSource)._M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (this->OptionSource)._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_68,pcVar2,pcVar2 + sVar1);
    cmsys::SystemTools::ConvertToUnixSlashes(&local_68);
    psVar6 = &this->SourceDir;
    bVar4 = cmsys::SystemTools::FileIsFullPath(psVar6);
    if (bVar4) {
      bVar4 = cmsys::SystemTools::FileIsFullPath(&local_68);
      if (bVar4) {
        bVar4 = cmsys::SystemTools::IsSubDirectory(&local_68,psVar6);
        if (bVar4) {
          cmSystemTools::RelativePath(&local_40,psVar6,&local_68);
          std::__cxx11::string::operator=((string *)&local_68,(string *)&local_40);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_40._M_dataplus._M_p != &local_40.field_2) {
            operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
          }
        }
      }
    }
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"SourceFile","");
    cVar3.xmlwr = local_48.xmlwr;
    cmXMLWriter::StartElement(local_48.xmlwr,&local_40);
    cmXMLWriter::Content<std::__cxx11::string>(cVar3.xmlwr,&local_68);
    cmXMLWriter::EndElement(cVar3.xmlwr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->OptionOutput)._M_string_length != 0) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"OutputFile","");
    cVar3.xmlwr = local_48.xmlwr;
    cmXMLWriter::StartElement(local_48.xmlwr,&local_68);
    cmXMLWriter::Content<std::__cxx11::string>(cVar3.xmlwr,&this->OptionOutput);
    cmXMLWriter::EndElement(cVar3.xmlwr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->OptionTargetType)._M_string_length == 0) {
    if ((this->OptionSource)._M_string_length == 0) goto LAB_0018d4cf;
    local_40._M_dataplus._M_p = "object file";
  }
  else {
    psVar6 = &this->OptionTargetType;
    iVar5 = std::__cxx11::string::compare((char *)psVar6);
    if (iVar5 == 0) {
      local_40._M_dataplus._M_p = "executable";
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)psVar6);
      if (iVar5 == 0) {
        local_40._M_dataplus._M_p = "shared library";
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)psVar6);
        if (iVar5 == 0) {
          local_40._M_dataplus._M_p = "module library";
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)psVar6);
          if (iVar5 != 0) goto LAB_0018d4cf;
          local_40._M_dataplus._M_p = "static library";
        }
      }
    }
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"OutputType","");
  cVar3.xmlwr = local_48.xmlwr;
  cmXMLWriter::StartElement(local_48.xmlwr,&local_68);
  cmXMLWriter::Content<char_const*>(cVar3.xmlwr,(char **)&local_40);
  cmXMLWriter::EndElement(cVar3.xmlwr);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
LAB_0018d4cf:
  cmXMLWriter::EndElement(local_48.xmlwr);
  return;
}

Assistant:

void cmCTestLaunch::WriteXMLAction(cmXMLElement& e2)
{
  e2.Comment("Meta-information about the build action");
  cmXMLElement e3(e2, "Action");

  // TargetName
  if (!this->OptionTargetName.empty()) {
    e3.Element("TargetName", this->OptionTargetName);
  }

  // Language
  if (!this->OptionLanguage.empty()) {
    e3.Element("Language", this->OptionLanguage);
  }

  // SourceFile
  if (!this->OptionSource.empty()) {
    std::string source = this->OptionSource;
    cmSystemTools::ConvertToUnixSlashes(source);

    // If file is in source tree use its relative location.
    if (cmSystemTools::FileIsFullPath(this->SourceDir) &&
        cmSystemTools::FileIsFullPath(source) &&
        cmSystemTools::IsSubDirectory(source, this->SourceDir)) {
      source = cmSystemTools::RelativePath(this->SourceDir, source);
    }

    e3.Element("SourceFile", source);
  }

  // OutputFile
  if (!this->OptionOutput.empty()) {
    e3.Element("OutputFile", this->OptionOutput);
  }

  // OutputType
  const char* outputType = nullptr;
  if (!this->OptionTargetType.empty()) {
    if (this->OptionTargetType == "EXECUTABLE") {
      outputType = "executable";
    } else if (this->OptionTargetType == "SHARED_LIBRARY") {
      outputType = "shared library";
    } else if (this->OptionTargetType == "MODULE_LIBRARY") {
      outputType = "module library";
    } else if (this->OptionTargetType == "STATIC_LIBRARY") {
      outputType = "static library";
    }
  } else if (!this->OptionSource.empty()) {
    outputType = "object file";
  }
  if (outputType) {
    e3.Element("OutputType", outputType);
  }
}